

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall
all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check::
test_method(all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check
            *this)

{
  allocator<unsigned_int> *this_00;
  allocator<double> *this_01;
  double dVar1;
  uint uVar2;
  value_type vVar3;
  undefined8 uVar4;
  type_conflict1 tVar5;
  bool bVar6;
  uint uVar7;
  reference pvVar8;
  reference pvVar9;
  reference puVar10;
  double *pdVar11;
  lazy_ostream *plVar12;
  reference pvVar13;
  reference puVar14;
  basic_cstring<const_char> local_720;
  basic_cstring<const_char> local_710;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_700;
  assertion_result local_6e0;
  basic_cstring<const_char> local_6c8;
  basic_cstring<const_char> local_6b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6a0;
  iterator cbd;
  Coboundary_range cbdrange;
  basic_cstring<const_char> local_670;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_660;
  assertion_result local_640;
  basic_cstring<const_char> local_628;
  basic_cstring<const_char> local_618;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_608;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_600;
  iterator bd;
  Boundary_range bdrange;
  basic_cstring<const_char> local_5d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5c0;
  assertion_result local_5a0;
  basic_cstring<const_char> local_588;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_548;
  assertion_result local_528;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  undefined1 local_4f0 [8];
  undefined1 local_4e8 [8];
  counting_iterator<unsigned_long,_boost::use_default,_boost::use_default> it;
  All_cells_range range;
  int local_4c8;
  int cbd_it;
  int bd_it;
  int i;
  Bitmap_cubical_complex_base ba;
  undefined1 local_468 [8];
  vector<double,_std::allocator<double>_> data;
  undefined1 local_448 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  value_type_conflict local_428 [39];
  undefined1 local_2f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected_coboundary;
  value_type_conflict local_2d0 [39];
  undefined1 local_198 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected_boundary;
  value_type_conflict3 local_178;
  value_type_conflict3 local_174;
  value_type_conflict3 local_170;
  value_type_conflict3 local_16c;
  value_type_conflict3 local_168;
  value_type_conflict3 local_164;
  value_type_conflict3 local_160;
  value_type_conflict3 local_15c;
  value_type_conflict3 local_158;
  value_type_conflict3 local_154;
  value_type_conflict3 local_150;
  value_type_conflict3 local_14c;
  value_type_conflict3 local_148;
  value_type_conflict3 local_144;
  value_type_conflict3 local_140;
  value_type_conflict3 local_13c;
  value_type_conflict3 local_138;
  value_type_conflict3 local_134;
  value_type_conflict3 local_130;
  value_type_conflict3 local_12c;
  value_type_conflict3 local_128;
  value_type_conflict3 local_124;
  value_type_conflict3 local_120;
  value_type_conflict3 local_11c;
  undefined1 local_118 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> expected_dimension;
  value_type_conflict2 local_f8;
  value_type_conflict2 local_f0;
  value_type_conflict2 local_e8;
  value_type_conflict2 local_e0;
  value_type_conflict2 local_d8;
  value_type_conflict2 local_d0;
  value_type_conflict2 local_c8;
  value_type_conflict2 local_c0;
  value_type_conflict2 local_b8;
  value_type_conflict2 local_b0;
  value_type_conflict2 local_a8;
  value_type_conflict2 local_a0;
  value_type_conflict2 local_98;
  value_type_conflict2 local_90;
  value_type_conflict2 local_88;
  value_type_conflict2 local_80;
  value_type_conflict2 local_78;
  value_type_conflict2 local_70;
  value_type_conflict2 local_68;
  value_type_conflict2 local_60;
  value_type_conflict2 local_58;
  value_type_conflict2 local_50;
  value_type_conflict2 local_48 [3];
  value_type_conflict2 local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> expected_filtration;
  all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check
  *this_local;
  
  expected_filtration.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_30);
  local_48[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,local_48);
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_50);
  local_58 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_58);
  local_60 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_60);
  local_68 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_68);
  local_70 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_70);
  local_78 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_78);
  local_80 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_80);
  local_88 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_88);
  local_90 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_90);
  local_98 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_98);
  local_a0 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_a0);
  local_a8 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_a8);
  local_b0 = 1.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_b0);
  local_b8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_b8);
  local_c0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_c0);
  local_c8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_c8);
  local_d0 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_d0);
  local_d8 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_d8);
  local_e0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_e0);
  local_e8 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_e8);
  local_f0 = 2.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_f0);
  local_f8 = 3.0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,&local_f8);
  expected_dimension.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_28,
             (value_type_conflict2 *)
             &expected_dimension.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
  local_11c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffee4);
  local_120 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffee0);
  local_124 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffedc);
  local_128 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffed8);
  local_12c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffed4);
  local_130 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffed0);
  local_134 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffecc);
  local_138 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffec8);
  local_13c = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffec4);
  local_140 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffec0);
  local_144 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffebc);
  local_148 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffeb8);
  local_14c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffeb4);
  local_150 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffeb0);
  local_154 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffeac);
  local_158 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffea8);
  local_15c = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffea4);
  local_160 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffea0);
  local_164 = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe9c);
  local_168 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe98);
  local_16c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe94);
  local_170 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe90);
  local_174 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe8c);
  local_178 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             &stack0xfffffffffffffe88);
  expected_boundary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
             (value_type_conflict3 *)
             ((long)&expected_boundary.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198);
  local_2d0[0x26] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x26);
  local_2d0[0x25] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x25);
  local_2d0[0x24] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x24);
  local_2d0[0x23] = 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x23);
  local_2d0[0x22] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x22);
  local_2d0[0x21] = 10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x21);
  local_2d0[0x20] = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x20);
  local_2d0[0x1f] = 0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1f);
  local_2d0[0x1e] = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1e);
  local_2d0[0x1d] = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1d);
  local_2d0[0x1c] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1c);
  local_2d0[0x1b] = 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1b);
  local_2d0[0x1a] = 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x1a);
  local_2d0[0x19] = 0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x19);
  local_2d0[0x18] = 9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x18);
  local_2d0[0x17] = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x17);
  local_2d0[0x16] = 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x16);
  local_2d0[0x15] = 0xe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x15);
  local_2d0[0x14] = 10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x14);
  local_2d0[0x13] = 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x13);
  local_2d0[0x12] = 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x12);
  local_2d0[0x11] = 0xe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x11);
  local_2d0[0x10] = 10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0x10);
  local_2d0[0xf] = 0x14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0xf);
  local_2d0[0xe] = 0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0xe);
  local_2d0[0xd] = 0x15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0xd);
  local_2d0[0xc] = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0xc);
  local_2d0[0xb] = 0xf;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 0xb);
  local_2d0[10] = 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 10);
  local_2d0[9] = 0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 9);
  local_2d0[8] = 0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 8);
  local_2d0[7] = 0x17;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 7);
  local_2d0[6] = 0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 6);
  local_2d0[5] = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 5);
  local_2d0[4] = 0xe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 4);
  local_2d0[3] = 0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 3);
  local_2d0[2] = 0x14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 2);
  local_2d0[1] = 0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0 + 1);
  local_2d0[0] = 0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,local_2d0);
  expected_coboundary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,
             (value_type_conflict *)
             &expected_coboundary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0);
  local_428[0x26] = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x26);
  local_428[0x25] = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x25);
  local_428[0x24] = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x24);
  local_428[0x23] = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x23);
  local_428[0x22] = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x22);
  local_428[0x21] = 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x21);
  local_428[0x20] = 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x20);
  local_428[0x1f] = 9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1f);
  local_428[0x1e] = 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1e);
  local_428[0x1d] = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1d);
  local_428[0x1c] = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1c);
  local_428[0x1b] = 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1b);
  local_428[0x1a] = 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x1a);
  local_428[0x19] = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x19);
  local_428[0x18] = 0xf;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x18);
  local_428[0x17] = 0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x17);
  local_428[0x16] = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x16);
  local_428[0x15] = 0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x15);
  local_428[0x14] = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x14);
  local_428[0x13] = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x13);
  local_428[0x12] = 0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x12);
  local_428[0x11] = 0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x11);
  local_428[0x10] = 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0x10);
  local_428[0xf] = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0xf);
  local_428[0xe] = 9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0xe);
  local_428[0xd] = 0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0xd);
  local_428[0xc] = 0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0xc);
  local_428[0xb] = 0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 0xb);
  local_428[10] = 0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 10);
  local_428[9] = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 9);
  local_428[8] = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 8);
  local_428[7] = 0xf;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 7);
  local_428[6] = 0x15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 6);
  local_428[5] = 0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 5);
  local_428[4] = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 4);
  local_428[3] = 0x15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 3);
  local_428[2] = 0x17;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 2);
  local_428[1] = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428 + 1);
  local_428[0] = 0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,local_428);
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x17;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,
             (value_type_conflict *)
             &sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<unsigned_int> *)
            ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_448,2,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_448,0);
  *pvVar8 = 2;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_448,1);
  *pvVar8 = 2;
  this_01 = (allocator<double> *)
            ((long)&ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this_01);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_468,4,this_01);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_468,0);
  *pvVar9 = 0.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_468,1);
  *pvVar9 = 1.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_468,2);
  *pvVar9 = 2.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_468,3);
  *pvVar9 = 3.0;
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Bitmap_cubical_complex_base
            ((Bitmap_cubical_complex_base<double> *)&bd_it,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_448,
             (vector<double,_std::allocator<double>_> *)local_468,true);
  cbd_it = 0;
  local_4c8 = 0;
  range.
  super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_End.super_type.m_iterator._4_4_ = 0;
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::all_cells_range
            ((Bitmap_cubical_complex_base<double> *)&it);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  ::begin((iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           *)local_4e8);
  while( true ) {
    boost::iterator_range_detail::
    iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
    ::end((iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           *)local_4f0);
    tVar5 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_4e8,
                       (iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_4f0);
    if (!tVar5) break;
    do {
      uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_500,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_500,0x3c6,&local_510);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_28,(long)cbd_it);
      dVar1 = *pvVar9;
      puVar10 = boost::iterators::detail::
                iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                             *)local_4e8);
      pdVar11 = Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_cell_data
                          ((Bitmap_cubical_complex_base<double> *)&bd_it,*puVar10);
      boost::test_tools::assertion_result::assertion_result
                (&local_528,(bool)(-(dVar1 == *pdVar11) & 1));
      plVar12 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_558,"expected_filtration[i] == ba.get_cell_data(*it)",0x2f);
      boost::unit_test::operator<<(&local_548,plVar12,&local_558);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_568,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::test_tools::tt_detail::report_assertion(&local_528,&local_548,&local_568,0x3c6,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_548);
      boost::test_tools::assertion_result::~assertion_result(&local_528);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    do {
      uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_578,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_588);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_578,0x3c7,&local_588);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
                          (long)cbd_it);
      uVar2 = *pvVar8;
      puVar10 = boost::iterators::detail::
                iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                             *)local_4e8);
      uVar7 = Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
                        ((Bitmap_cubical_complex_base<double> *)&bd_it,*puVar10);
      boost::test_tools::assertion_result::assertion_result(&local_5a0,uVar2 == uVar7);
      plVar12 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5d0,"expected_dimension[i] == ba.get_dimension_of_a_cell(*it)",0x38);
      boost::unit_test::operator<<(&local_5c0,plVar12,&local_5d0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 &bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                 ,0x75);
      boost::test_tools::tt_detail::report_assertion
                (&local_5a0,&local_5c0,
                 &bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x3c7,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_5c0);
      boost::test_tools::assertion_result::~assertion_result(&local_5a0);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    puVar10 = boost::iterators::detail::
              iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                           *)local_4e8);
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::boundary_range
              ((Boundary_range *)&bd,(Bitmap_cubical_complex_base<double> *)&bd_it,*puVar10);
    local_600._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    while( true ) {
      local_608._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
      bVar6 = __gnu_cxx::operator!=(&local_600,&local_608);
      if (!bVar6) break;
      do {
        uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_618,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_628);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_618,0x3cb,&local_628);
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,
                             (long)local_4c8);
        vVar3 = *pvVar13;
        puVar14 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_600);
        boost::test_tools::assertion_result::assertion_result(&local_640,vVar3 == *puVar14);
        plVar12 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_670,"expected_boundary[bd_it] == *bd",0x1f);
        boost::unit_test::operator<<(&local_660,plVar12,&local_670);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   &cbdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion
                  (&local_640,&local_660,
                   &cbdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x3cb,1,0,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_660);
        boost::test_tools::assertion_result::~assertion_result(&local_640);
        bVar6 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar6);
      local_4c8 = local_4c8 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_600);
    }
    puVar10 = boost::iterators::detail::
              iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                           *)local_4e8);
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::coboundary_range
              ((Coboundary_range *)&cbd,(Bitmap_cubical_complex_base<double> *)&bd_it,*puVar10);
    local_6a0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cbd);
    while( true ) {
      local_6a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cbd);
      bVar6 = __gnu_cxx::operator!=(&local_6a0,&local_6a8);
      if (!bVar6) break;
      do {
        uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_6b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6c8);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_6b8,0x3d1,&local_6c8);
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0,
                             (long)range.
                                   super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                                   .
                                   super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                                   .
                                   super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                                   .m_End.super_type.m_iterator._4_4_);
        vVar3 = *pvVar13;
        puVar14 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_6a0);
        boost::test_tools::assertion_result::assertion_result(&local_6e0,vVar3 == *puVar14);
        plVar12 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_710,"expected_coboundary[cbd_it] == *cbd",0x23);
        boost::unit_test::operator<<(&local_700,plVar12,&local_710);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_720,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion(&local_6e0,&local_700,&local_720,0x3d1,1,0,0)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_700);
        boost::test_tools::assertion_result::~assertion_result(&local_6e0);
        bVar6 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar6);
      range.
      super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
      .m_End.super_type.m_iterator._4_4_ =
           range.
           super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           .m_End.super_type.m_iterator._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_6a0);
    }
    cbd_it = cbd_it + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cbd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                  *)local_4e8);
  }
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::~Bitmap_cubical_complex_base
            ((Bitmap_cubical_complex_base<double> *)&bd_it);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_468);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_448);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check) {
  std::vector<double> expected_filtration;
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(3);
  expected_filtration.push_back(3);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(3);
  expected_filtration.push_back(3);

  std::vector<unsigned> expected_dimension;
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);

  std::vector<size_t> expected_boundary;
  expected_boundary.push_back(0);
  expected_boundary.push_back(2);
  expected_boundary.push_back(2);
  expected_boundary.push_back(4);
  expected_boundary.push_back(0);
  expected_boundary.push_back(10);
  expected_boundary.push_back(1);
  expected_boundary.push_back(11);
  expected_boundary.push_back(7);
  expected_boundary.push_back(5);
  expected_boundary.push_back(2);
  expected_boundary.push_back(12);
  expected_boundary.push_back(3);
  expected_boundary.push_back(13);
  expected_boundary.push_back(9);
  expected_boundary.push_back(7);
  expected_boundary.push_back(4);
  expected_boundary.push_back(14);
  expected_boundary.push_back(10);
  expected_boundary.push_back(12);
  expected_boundary.push_back(12);
  expected_boundary.push_back(14);
  expected_boundary.push_back(10);
  expected_boundary.push_back(20);
  expected_boundary.push_back(11);
  expected_boundary.push_back(21);
  expected_boundary.push_back(17);
  expected_boundary.push_back(15);
  expected_boundary.push_back(12);
  expected_boundary.push_back(22);
  expected_boundary.push_back(13);
  expected_boundary.push_back(23);
  expected_boundary.push_back(19);
  expected_boundary.push_back(17);
  expected_boundary.push_back(14);
  expected_boundary.push_back(24);
  expected_boundary.push_back(20);
  expected_boundary.push_back(22);
  expected_boundary.push_back(22);
  expected_boundary.push_back(24);

  std::vector<size_t> expected_coboundary;
  expected_coboundary.push_back(5);
  expected_coboundary.push_back(1);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(7);
  expected_coboundary.push_back(1);
  expected_coboundary.push_back(3);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(9);
  expected_coboundary.push_back(3);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(5);
  expected_coboundary.push_back(15);
  expected_coboundary.push_back(11);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(7);
  expected_coboundary.push_back(17);
  expected_coboundary.push_back(11);
  expected_coboundary.push_back(13);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(9);
  expected_coboundary.push_back(19);
  expected_coboundary.push_back(13);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(15);
  expected_coboundary.push_back(21);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(17);
  expected_coboundary.push_back(21);
  expected_coboundary.push_back(23);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(19);
  expected_coboundary.push_back(23);

  std::vector<unsigned> sizes(2);
  sizes[0] = 2;
  sizes[1] = 2;

  std::vector<double> data(4);
  data[0] = 0;
  data[1] = 1;
  data[2] = 2;
  data[3] = 3;

  Bitmap_cubical_complex_base ba(sizes, data);
  int i = 0;
  int bd_it = 0;
  int cbd_it = 0;

  Bitmap_cubical_complex_base::All_cells_range range = ba.all_cells_range();
  for (auto it = range.begin(); it != range.end(); ++it) {
    BOOST_CHECK(expected_filtration[i] == ba.get_cell_data(*it));
    BOOST_CHECK(expected_dimension[i] == ba.get_dimension_of_a_cell(*it));

    Bitmap_cubical_complex_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin(); bd != bdrange.end(); ++bd) {
      BOOST_CHECK(expected_boundary[bd_it] == *bd);
      ++bd_it;
    }

    Bitmap_cubical_complex_base::Coboundary_range cbdrange = ba.coboundary_range(*it);
    for (auto cbd = cbdrange.begin(); cbd != cbdrange.end(); ++cbd) {
      BOOST_CHECK(expected_coboundary[cbd_it] == *cbd);
      ++cbd_it;
    }
    ++i;
  }
}